

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotManager.cpp
# Opt level: O3

CK_RV __thiscall
SlotManager::getSlotList
          (SlotManager *this,ObjectStore *objectStore,CK_BBOOL tokenPresent,CK_SLOT_ID_PTR pSlotList
          ,CK_ULONG_PTR pulCount)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  Token *pTVar4;
  _Base_ptr p_Var5;
  CK_SLOT_ID CVar6;
  size_t slotID;
  long lVar7;
  _Self __tmp_1;
  CK_ULONG CVar8;
  bool bVar9;
  long lVar10;
  _Self __tmp;
  CK_RV CVar11;
  long lVar12;
  
  if (pulCount == (CK_ULONG_PTR)0x0) {
    return 7;
  }
  p_Var5 = (this->slots)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->slots)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    CVar8 = 0;
    if (pSlotList == (CK_SLOT_ID_PTR)0x0) goto LAB_0017010e;
  }
  else {
    CVar8 = 0;
    bVar9 = false;
    bVar3 = false;
    do {
      if ((tokenPresent == '\0') ||
         (bVar2 = Slot::isTokenPresent((Slot *)p_Var5[1]._M_parent), bVar2)) {
        CVar8 = CVar8 + 1;
      }
      pTVar4 = Slot::getToken((Slot *)p_Var5[1]._M_parent);
      if (pTVar4 != (Token *)0x0) {
        pTVar4 = Slot::getToken((Slot *)p_Var5[1]._M_parent);
        bVar2 = Token::isInitialized(pTVar4);
        bVar3 = bVar9;
        if (!bVar2) {
          bVar9 = true;
          bVar3 = true;
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    if (pSlotList == (CK_SLOT_ID_PTR)0x0) {
      if (bVar3) {
        CVar11 = 0;
        goto LAB_00170139;
      }
LAB_0017010e:
      slotID = ObjectStore::getTokenCount(objectStore);
      CVar11 = 0;
      insertToken(this,objectStore,slotID,(ObjectStoreToken *)0x0);
      CVar8 = CVar8 + 1;
      goto LAB_00170139;
    }
    CVar11 = 0x150;
    if (*pulCount < CVar8) goto LAB_00170139;
  }
  p_Var5 = (this->slots)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    lVar10 = 0;
    lVar7 = CVar8 - 1;
    do {
      lVar12 = lVar7;
      if ((tokenPresent != '\x01') ||
         (bVar3 = Slot::isTokenPresent((Slot *)p_Var5[1]._M_parent), bVar3)) {
        bVar3 = Slot::isTokenPresent((Slot *)p_Var5[1]._M_parent);
        if (bVar3) {
          pTVar4 = Slot::getToken((Slot *)p_Var5[1]._M_parent);
          bVar3 = Token::isInitialized(pTVar4);
          if (bVar3) goto LAB_001700b4;
          CVar6 = Slot::getSlotID((Slot *)p_Var5[1]._M_parent);
          lVar12 = lVar7 + -1;
        }
        else {
LAB_001700b4:
          CVar6 = Slot::getSlotID((Slot *)p_Var5[1]._M_parent);
          lVar7 = lVar10;
          lVar10 = lVar10 + 1;
        }
        pSlotList[lVar7] = CVar6;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      lVar7 = lVar12;
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  CVar11 = 0;
LAB_00170139:
  *pulCount = CVar8;
  return CVar11;
}

Assistant:

CK_RV SlotManager::getSlotList(ObjectStore* objectStore, CK_BBOOL tokenPresent, CK_SLOT_ID_PTR pSlotList, CK_ULONG_PTR pulCount)
{
	size_t size( 0 );

	if (pulCount == NULL) return CKR_ARGUMENTS_BAD;

	// Calculate the size of the list
	bool uninitialized = false;
	for (SlotMap::iterator i = slots.begin(); i != slots.end(); i++)
	{
		if ((tokenPresent == CK_FALSE) || i->second->isTokenPresent())
		{
			size++;
		}

		if (i->second->getToken() != NULL && i->second->getToken()->isInitialized() == false)
		{
			uninitialized = true;
		}
	}

	// The user wants the size of the list
	if (pSlotList == NULL)
	{
		// Always have an uninitialized token
		if (uninitialized == false)
		{
			insertToken(objectStore, objectStore->getTokenCount(), NULL);
			size++;
		}

		*pulCount = size;

		return CKR_OK;
	}

	// Is the given buffer too small?
	if (*pulCount < size)
	{
		*pulCount = size;

		return CKR_BUFFER_TOO_SMALL;
	}

	size_t startIx( 0 );
	size_t endIx( size-1 );

	for (SlotMap::iterator i = slots.begin(); i != slots.end(); i++)
	{
		if ((tokenPresent == CK_TRUE) && !i->second->isTokenPresent())
		{// only show token if present on slot. But this slot has no token so we continue
			continue;
		}
		// put uninitialized last. After all initialized or slots without tokens.
		if ( i->second->isTokenPresent() && !i->second->getToken()->isInitialized() ) {
			pSlotList[endIx--] =  i->second->getSlotID();
		} else {
			pSlotList[startIx++] = i->second->getSlotID();
		}
	}
	assert(startIx==endIx+1);
	*pulCount = size;

	return CKR_OK;
}